

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O1

void __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler2>_>
::Read(NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler2>_>
       *this,BinaryReader<mp::internal::EndiannessConverter> *bound_reader)

{
  NLHeader *pNVar1;
  BinaryReader<mp::internal::EndiannessConverter> *pBVar2;
  byte *pbVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  uint uVar7;
  int iVar8;
  byte bVar9;
  char code;
  bool bVar10;
  bool bVar11;
  undefined1 local_58 [16];
  ArgList local_40;
  
  bVar10 = bound_reader == (BinaryReader<mp::internal::EndiannessConverter> *)0x0;
  pNVar1 = this->header_;
  this->num_vars_and_exprs_ =
       (pNVar1->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_single_objs +
       (pNVar1->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_objs +
       (pNVar1->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_single_cons +
       (pNVar1->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_cons +
       (pNVar1->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_both +
       (pNVar1->super_NLProblemInfo).super_NLProblemInfo_C.num_vars;
  do {
    pBVar2 = this->reader_;
    pbVar3 = (byte *)(pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_;
    (pBVar2->super_BinaryReaderBase).super_ReaderBase.token_ = (char *)pbVar3;
    (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_ = (char *)(pbVar3 + 1);
    bVar9 = *pbVar3;
    if (0x61 < bVar9) {
      if (bVar9 < 0x6b) {
        if (bVar9 == 0x62) {
          if (bVar10 == false) {
            if (bound_reader == (BinaryReader<mp::internal::EndiannessConverter> *)0x0) {
              local_58 = (undefined1  [16])0x0;
              local_40.types_ = 0;
              local_40.field_1.values_ = (Value *)local_58;
              BinaryReaderBase::ReportError
                        (&pBVar2->super_BinaryReaderBase,(CStringRef)0x2654cf,&local_40);
            }
            pcVar4 = (bound_reader->super_BinaryReaderBase).super_ReaderBase.ptr_;
            pcVar5 = (bound_reader->super_BinaryReaderBase).super_ReaderBase.start_;
            pcVar6 = (bound_reader->super_BinaryReaderBase).super_ReaderBase.token_;
            (pBVar2->super_BinaryReaderBase).super_ReaderBase.end_ =
                 (bound_reader->super_BinaryReaderBase).super_ReaderBase.end_;
            (pBVar2->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar6;
            (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar4;
            (pBVar2->super_BinaryReaderBase).super_ReaderBase.start_ = pcVar5;
            std::__cxx11::string::_M_assign
                      ((string *)&(pBVar2->super_BinaryReaderBase).super_ReaderBase.name_);
            bVar11 = true;
            bound_reader = (BinaryReader<mp::internal::EndiannessConverter> *)0x0;
          }
          else {
            NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<TestNLHandler2>>
            ::
            ReadBounds<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<TestNLHandler2>>::VarHandler>
                      ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<TestNLHandler2>>
                        *)this);
            bVar9 = (byte)this->flags_ & 1;
            bVar11 = bVar9 == 0;
            bVar10 = (bool)(bVar10 & -bVar9);
          }
          goto LAB_001a8ecc;
        }
        if (bVar9 != 100) goto switchD_001a8ce8_caseD_44;
        NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<TestNLHandler2>>
        ::
        ReadInitialValues<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<TestNLHandler2>>::AlgebraicConHandler>
                  ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<TestNLHandler2>>
                    *)this);
      }
      else if (bVar9 == 0x6b) {
        ReadColumnSizes<true>(this);
      }
      else if (bVar9 == 0x72) {
        NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<TestNLHandler2>>
        ::
        ReadBounds<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<TestNLHandler2>>::AlgebraicConHandler>
                  ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<TestNLHandler2>>
                    *)this);
      }
      else {
        if (bVar9 != 0x78) goto switchD_001a8ce8_caseD_44;
        NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<TestNLHandler2>>
        ::
        ReadInitialValues<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<TestNLHandler2>>::VarHandler>
                  ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<TestNLHandler2>>
                    *)this);
      }
      goto LAB_001a8eca;
    }
    switch(bVar9) {
    case 0x43:
      ReadUInt(this,(this->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_algebraic_cons);
      goto LAB_001a8def;
    case 0x44:
    case 0x45:
    case 0x48:
    case 0x49:
    case 0x4d:
    case 0x4e:
    case 0x50:
    case 0x51:
    case 0x52:
    case 0x54:
    case 0x55:
switchD_001a8ce8_caseD_44:
      local_58 = (undefined1  [16])0x0;
      local_40.types_ = 0;
      local_40.field_1.values_ = (Value *)local_58;
      BinaryReaderBase::ReportError(&pBVar2->super_BinaryReaderBase,(CStringRef)0x2693ca,&local_40);
    case 0x46:
      ReadUInt(this,(this->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_funcs);
      uVar7 = BinaryReader<mp::internal::EndiannessConverter>::ReadUInt(this->reader_);
      if (1 < uVar7) {
        local_58 = (undefined1  [16])0x0;
        local_40.types_ = 0;
        local_40.field_1.values_ = (Value *)local_58;
        BinaryReaderBase::ReportError
                  (&this->reader_->super_BinaryReaderBase,(CStringRef)0x268903,&local_40);
      }
      BinaryReader<mp::internal::EndiannessConverter>::ReadInt<int>(this->reader_);
      BinaryReader<mp::internal::EndiannessConverter>::ReadString(this->reader_);
      break;
    case 0x47:
      NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<TestNLHandler2>>
      ::
      ReadLinearExpr<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<TestNLHandler2>>::ObjHandler>
                ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<TestNLHandler2>>
                  *)this);
      break;
    case 0x4a:
      NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<TestNLHandler2>>
      ::
      ReadLinearExpr<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<TestNLHandler2>>::AlgebraicConHandler>
                ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<TestNLHandler2>>
                  *)this);
      break;
    case 0x4b:
      ReadColumnSizes<false>(this);
      break;
    case 0x4c:
      ReadUInt(this,(this->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_logical_cons);
      ReadLogicalExpr(this);
      break;
    case 0x4f:
      ReadUInt(this,(this->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_objs);
      BinaryReader<mp::internal::EndiannessConverter>::ReadUInt(this->reader_);
LAB_001a8def:
      pBVar2 = this->reader_;
      pcVar4 = (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_;
      (pBVar2->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar4;
      (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar4 + 1;
      code = *pcVar4;
      bVar11 = true;
LAB_001a8e93:
      ReadNumericExpr(this,code,bVar11);
      break;
    case 0x53:
      uVar7 = BinaryReader<mp::internal::EndiannessConverter>::ReadUInt(pBVar2);
      if (7 < (int)uVar7) {
        local_58 = (undefined1  [16])0x0;
        local_40.types_ = 0;
        local_40.field_1.values_ = (Value *)local_58;
        BinaryReaderBase::ReportError
                  (&this->reader_->super_BinaryReaderBase,(CStringRef)0x26903e,&local_40);
      }
      switch(uVar7 & 3) {
      case 0:
        NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<TestNLHandler2>>
        ::
        ReadSuffix<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<TestNLHandler2>>::VarHandler>
                  ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<TestNLHandler2>>
                    *)this,uVar7);
        break;
      case 1:
        NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<TestNLHandler2>>
        ::
        ReadSuffix<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<TestNLHandler2>>::ConHandler>
                  ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<TestNLHandler2>>
                    *)this,uVar7);
        break;
      case 2:
        NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<TestNLHandler2>>
        ::
        ReadSuffix<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<TestNLHandler2>>::ObjHandler>
                  ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<TestNLHandler2>>
                    *)this,uVar7);
        break;
      case 3:
        NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<TestNLHandler2>>
        ::
        ReadSuffix<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<TestNLHandler2>>::ProblemHandler>
                  ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<TestNLHandler2>>
                    *)this,uVar7);
      }
      break;
    case 0x56:
      ReadUInt(this,(this->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_vars,
               this->num_vars_and_exprs_);
      iVar8 = BinaryReader<mp::internal::EndiannessConverter>::ReadUInt(this->reader_);
      BinaryReader<mp::internal::EndiannessConverter>::ReadUInt(this->reader_);
      if (iVar8 != 0) {
        NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<TestNLHandler2>>
        ::
        ReadLinearExpr<mp::NLHandler<mp::NullNLHandler<TestNLHandler2::TestExpr>,TestNLHandler2::TestExpr>::LinearExprHandler>
                  ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<TestNLHandler2>>
                    *)this,iVar8);
      }
      pBVar2 = this->reader_;
      pcVar4 = (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_;
      (pBVar2->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar4;
      (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar4 + 1;
      code = *pcVar4;
      bVar11 = false;
      goto LAB_001a8e93;
    default:
      if ((bVar9 != 0) || ((byte *)(pBVar2->super_BinaryReaderBase).super_ReaderBase.end_ != pbVar3)
         ) goto switchD_001a8ce8_caseD_44;
      if (bVar10 != false) {
        local_58 = (undefined1  [16])0x0;
        local_40.types_ = 0;
        local_40.field_1.values_ = (Value *)local_58;
        BinaryReaderBase::ReportError
                  (&pBVar2->super_BinaryReaderBase,(CStringRef)0x2653a3,&local_40);
      }
      bVar11 = false;
      goto LAB_001a8ecc;
    }
LAB_001a8eca:
    bVar11 = true;
LAB_001a8ecc:
    if (!bVar11) {
      return;
    }
  } while( true );
}

Assistant:

void NLReader<Reader, Handler>::Read(Reader *bound_reader) {
  bool read_bounds = bound_reader == 0;
  // TextReader::ReadHeader checks that this doesn't overflow.
  num_vars_and_exprs_ = header_.num_vars +
      header_.num_common_exprs_in_both +
      header_.num_common_exprs_in_cons +
      header_.num_common_exprs_in_objs +
      header_.num_common_exprs_in_single_cons +
      header_.num_common_exprs_in_single_objs;
  for (;;) {
    char c = reader_.ReadChar();
    switch (c) {
    case 'C': {
      // Nonlinear part of an algebraic constraint body.
      int index = ReadUInt(header_.num_algebraic_cons);
      reader_.ReadTillEndOfLine();
      handler_.OnAlgebraicCon(index, ReadNumericExpr(true));
      break;
    }
    case 'L': {
      // Logical constraint expression.
      int index = ReadUInt(header_.num_logical_cons);
      reader_.ReadTillEndOfLine();
      handler_.OnLogicalCon(index, ReadLogicalExpr());
      break;
    }
    case 'O': {
      // Objective type and nonlinear part of an objective expression.
      int index = ReadUInt(header_.num_objs);
      int obj_type = reader_.ReadUInt();
      reader_.ReadTillEndOfLine();
      NumericExpr expr = ReadNumericExpr(true);
      if (handler_.NeedObj(index))
        handler_.OnObj(handler_.resulting_obj_index(index),
                       obj_type != 0 ? obj::MAX : obj::MIN,
                       expr);
      break;
    }
    case 'V': {
      // Defined variable definition (must precede V, C, L, O segments
      // where used).
      int expr_index = ReadUInt(header_.num_vars, num_vars_and_exprs_);
      expr_index -= header_.num_vars;
      int num_linear_terms = reader_.ReadUInt();
      int position = reader_.ReadUInt();
      reader_.ReadTillEndOfLine();
      typename Handler::LinearExprHandler
          expr_handler(handler_.BeginCommonExpr(expr_index, num_linear_terms));
      if (num_linear_terms != 0)
        ReadLinearExpr(num_linear_terms, expr_handler);
      handler_.EndCommonExpr(expr_index, ReadNumericExpr(), position);
      break;
    }
    case 'F': {
      // Imported function description.
      int index = ReadUInt(header_.num_funcs);
      int type = reader_.ReadUInt();
      if (type != func::NUMERIC && type != func::SYMBOLIC)
        reader_.ReportError("invalid function type");
      int num_args = reader_.template ReadInt<int>();
      fmt::StringRef name = reader_.ReadName();
      reader_.ReadTillEndOfLine();
      handler_.OnFunction(index, name, num_args, static_cast<func::Type>(type));
      break;
    }
    case 'G':
      // Linear part of an objective expression & gradient sparsity.
      ReadLinearExpr<ObjHandler>();
      break;
    case 'J':
      // Jacobian sparsity & linear terms in constraints.
      ReadLinearExpr<AlgebraicConHandler>();
      break;
    case 'S': {
      // Suffix values.
      int info = reader_.ReadUInt();
      if (info > (internal::SUFFIX_KIND_MASK | suf::FLOAT))
        reader_.ReportError("invalid suffix kind");
      switch (info & internal::SUFFIX_KIND_MASK) {
      case suf::VAR:
        ReadSuffix<VarHandler>(info);
        break;
      case suf::CON:
        ReadSuffix<ConHandler>(info);
        break;
      case suf::OBJ:
        ReadSuffix<ObjHandler>(info);
        break;
      case suf::PROBLEM:
        ReadSuffix<ProblemHandler>(info);
        break;
      }
      break;
    }
    case 'b':
      // Bounds on variables.
      if (read_bounds) {
        ReadBounds<VarHandler>();
        reader_.ptr();
        if ((flags_ & READ_BOUNDS_FIRST) != 0)
          return;
        read_bounds = false;
        break;
      }
      if (!bound_reader)
        reader_.ReportError("duplicate 'b' segment");
      reader_ = *bound_reader;
      bound_reader = 0;
      break;
    case 'r':
      // Bounds on algebraic constraint bodies ("ranges").
      ReadBounds<AlgebraicConHandler>();
      break;
    case 'K':
      // Jacobian sparsity & linear constraint term matrix column sizes
      // (must precede all J segments).
      ReadColumnSizes<false>();
      break;
    case 'k':
      // Jacobian sparsity & linear constraint term matrix cumulative column
      // sizes (must precede all J segments).
      ReadColumnSizes<true>();
      break;
    case 'x':
      // Primal initial guess.
      ReadInitialValues<VarHandler>();
      break;
    case 'd':
      // Dual initial guess.
      ReadInitialValues<AlgebraicConHandler>();
      break;
    case '\0':
      if (reader_.IsEOF()) {
        if (read_bounds)
          reader_.ReportError("segment 'b' missing");
        return;
      }
      // Fall through.
    default:
      reader_.ReportError("invalid segment type");
    }
  }
}